

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImFormatStringV(char *buf,size_t buf_size,char *fmt,__va_list_tag *args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  iVar2 = vsnprintf(buf,buf_size,fmt,args);
  if (buf != (char *)0x0) {
    iVar3 = (int)buf_size + -1;
    iVar1 = iVar3;
    if (iVar2 < (int)buf_size) {
      iVar1 = iVar2;
    }
    bVar4 = iVar2 == -1;
    iVar2 = iVar1;
    if (bVar4) {
      iVar2 = iVar3;
    }
    buf[iVar2] = '\0';
  }
  return iVar2;
}

Assistant:

int ImFormatStringV(char* buf, size_t buf_size, const char* fmt, va_list args)
{
    int w = vsnprintf(buf, buf_size, fmt, args);
    if (buf == NULL)
        return w;
    if (w == -1 || w >= (int)buf_size)
        w = (int)buf_size - 1;
    buf[w] = 0;
    return w;
}